

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O0

Value * duckdb::ScalarFunctionExtractor::ResultType(ScalarFunctionCatalogEntry *entry,idx_t offset)

{
  ScalarFunction *in_RDI;
  FunctionStability in_stack_fffffffffffffeef;
  
  FunctionSet<duckdb::ScalarFunction>::GetFunctionByOffset
            ((FunctionSet<duckdb::ScalarFunction> *)in_RDI,(idx_t)in_RDI);
  FunctionStabilityToValue(in_stack_fffffffffffffeef);
  ScalarFunction::~ScalarFunction(in_RDI);
  return (Value *)in_RDI;
}

Assistant:

static Value ResultType(ScalarFunctionCatalogEntry &entry, idx_t offset) {
		return FunctionStabilityToValue(entry.functions.GetFunctionByOffset(offset).stability);
	}